

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsC.cxx
# Opt level: O0

void __thiscall
cmDependsC::cmDependsC
          (cmDependsC *this,cmLocalGenerator *lg,string *targetDir,string *lang,
          DependencyMap *validDeps)

{
  char *pcVar1;
  char *cr;
  undefined1 local_108 [8];
  string complainRegexVar;
  char *sr;
  undefined1 local_d8 [8];
  string scanRegexVar;
  undefined1 local_b0 [8];
  string complainRegex;
  undefined1 local_88 [8];
  string scanRegex;
  cmMakefile *mf;
  string local_50;
  DependencyMap *local_30;
  DependencyMap *validDeps_local;
  string *lang_local;
  string *targetDir_local;
  cmLocalGenerator *lg_local;
  cmDependsC *this_local;
  
  local_30 = validDeps;
  validDeps_local = (DependencyMap *)lang;
  lang_local = targetDir;
  targetDir_local = (string *)lg;
  lg_local = (cmLocalGenerator *)this;
  std::__cxx11::string::string((string *)&local_50,(string *)targetDir);
  cmDepends::cmDepends(&this->super_cmDepends,lg,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  (this->super_cmDepends)._vptr_cmDepends = (_func_int **)&PTR__cmDependsC_00a25968;
  cmsys::RegularExpression::RegularExpression(&this->IncludeRegexLine);
  cmsys::RegularExpression::RegularExpression(&this->IncludeRegexScan);
  cmsys::RegularExpression::RegularExpression(&this->IncludeRegexComplain);
  std::__cxx11::string::string((string *)&this->IncludeRegexLineString);
  std::__cxx11::string::string((string *)&this->IncludeRegexScanString);
  std::__cxx11::string::string((string *)&this->IncludeRegexComplainString);
  std::__cxx11::string::string((string *)&this->IncludeRegexTransformString);
  cmsys::RegularExpression::RegularExpression(&this->IncludeRegexTransform);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->TransformRules);
  this->ValidDeps = local_30;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->Encountered);
  std::
  queue<cmDependsC::UnscannedEntry,std::deque<cmDependsC::UnscannedEntry,std::allocator<cmDependsC::UnscannedEntry>>>
  ::queue<std::deque<cmDependsC::UnscannedEntry,std::allocator<cmDependsC::UnscannedEntry>>,void>
            ((queue<cmDependsC::UnscannedEntry,std::deque<cmDependsC::UnscannedEntry,std::allocator<cmDependsC::UnscannedEntry>>>
              *)&this->Unscanned);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsC::cmIncludeLines_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsC::cmIncludeLines_*>_>_>
  ::map(&this->FileCache);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->HeaderLocationCache);
  std::__cxx11::string::string((string *)&this->CacheFileName);
  scanRegex.field_2._8_8_ = cmLocalGenerator::GetMakefile((cmLocalGenerator *)targetDir_local);
  cmDepends::SetIncludePathFromLanguage(&this->super_cmDepends,(string *)validDeps_local);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_88,"^.*$",(allocator<char> *)(complainRegex.field_2._M_local_buf + 0xf)
            );
  std::allocator<char>::~allocator((allocator<char> *)(complainRegex.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_b0,"^$",(allocator<char> *)(scanRegexVar.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(scanRegexVar.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_d8,"CMAKE_",(allocator<char> *)((long)&sr + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&sr + 7));
  std::__cxx11::string::operator+=((string *)local_d8,(string *)validDeps_local);
  std::__cxx11::string::operator+=((string *)local_d8,"_INCLUDE_REGEX_SCAN");
  complainRegexVar.field_2._8_8_ =
       (size_type)cmMakefile::GetDefinition(scanRegex.field_2._8_8_,(string *)local_d8);
  if ((char *)complainRegexVar.field_2._8_8_ != (char *)0x0) {
    std::__cxx11::string::operator=((string *)local_88,(char *)complainRegexVar.field_2._8_8_);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_108,"CMAKE_",(allocator<char> *)((long)&cr + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&cr + 7));
  std::__cxx11::string::operator+=((string *)local_108,(string *)validDeps_local);
  std::__cxx11::string::operator+=((string *)local_108,"_INCLUDE_REGEX_COMPLAIN");
  pcVar1 = cmMakefile::GetDefinition((cmMakefile *)scanRegex.field_2._8_8_,(string *)local_108);
  if (pcVar1 != (char *)0x0) {
    std::__cxx11::string::operator=((string *)local_b0,pcVar1);
  }
  std::__cxx11::string::~string((string *)local_108);
  std::__cxx11::string::~string((string *)local_d8);
  cmsys::RegularExpression::compile
            (&this->IncludeRegexLine,"^[ \t]*[#%][ \t]*(include|import)[ \t]*[<\"]([^\">]+)([\">])")
  ;
  cmsys::RegularExpression::compile(&this->IncludeRegexScan,(string *)local_88);
  cmsys::RegularExpression::compile(&this->IncludeRegexComplain,(string *)local_b0);
  std::__cxx11::string::operator=
            ((string *)&this->IncludeRegexLineString,
             "#IncludeRegexLine: ^[ \t]*[#%][ \t]*(include|import)[ \t]*[<\"]([^\">]+)([\">])");
  std::__cxx11::string::operator=((string *)&this->IncludeRegexScanString,"#IncludeRegexScan: ");
  std::__cxx11::string::operator+=((string *)&this->IncludeRegexScanString,(string *)local_88);
  std::__cxx11::string::operator=
            ((string *)&this->IncludeRegexComplainString,"#IncludeRegexComplain: ");
  std::__cxx11::string::operator+=((string *)&this->IncludeRegexComplainString,(string *)local_b0);
  SetupTransforms(this);
  std::__cxx11::string::operator=
            ((string *)&this->CacheFileName,(string *)&(this->super_cmDepends).TargetDirectory);
  std::__cxx11::string::operator+=((string *)&this->CacheFileName,"/");
  std::__cxx11::string::operator+=((string *)&this->CacheFileName,(string *)validDeps_local);
  std::__cxx11::string::operator+=((string *)&this->CacheFileName,".includecache");
  ReadCacheFile(this);
  std::__cxx11::string::~string((string *)local_b0);
  std::__cxx11::string::~string((string *)local_88);
  return;
}

Assistant:

cmDependsC::cmDependsC(cmLocalGenerator* lg, const std::string& targetDir,
                       const std::string& lang, const DependencyMap* validDeps)
  : cmDepends(lg, targetDir)
  , ValidDeps(validDeps)
{
  cmMakefile* mf = lg->GetMakefile();

  // Configure the include file search path.
  this->SetIncludePathFromLanguage(lang);

  // Configure regular expressions.
  std::string scanRegex = "^.*$";
  std::string complainRegex = "^$";
  {
    std::string scanRegexVar = "CMAKE_";
    scanRegexVar += lang;
    scanRegexVar += "_INCLUDE_REGEX_SCAN";
    if (const char* sr = mf->GetDefinition(scanRegexVar)) {
      scanRegex = sr;
    }
    std::string complainRegexVar = "CMAKE_";
    complainRegexVar += lang;
    complainRegexVar += "_INCLUDE_REGEX_COMPLAIN";
    if (const char* cr = mf->GetDefinition(complainRegexVar)) {
      complainRegex = cr;
    }
  }

  this->IncludeRegexLine.compile(INCLUDE_REGEX_LINE);
  this->IncludeRegexScan.compile(scanRegex);
  this->IncludeRegexComplain.compile(complainRegex);
  this->IncludeRegexLineString = INCLUDE_REGEX_LINE_MARKER INCLUDE_REGEX_LINE;
  this->IncludeRegexScanString = INCLUDE_REGEX_SCAN_MARKER;
  this->IncludeRegexScanString += scanRegex;
  this->IncludeRegexComplainString = INCLUDE_REGEX_COMPLAIN_MARKER;
  this->IncludeRegexComplainString += complainRegex;

  this->SetupTransforms();

  this->CacheFileName = this->TargetDirectory;
  this->CacheFileName += "/";
  this->CacheFileName += lang;
  this->CacheFileName += ".includecache";

  this->ReadCacheFile();
}